

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

void pdqsort_detail::
     insertion_sort<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0>
               (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      end,anon_class_8_1_898a9ca8 comp)

{
  bool bVar1;
  reference pCVar2;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  *this;
  anon_class_8_1_898a9ca8 *in_stack_00000008;
  CliqueVar in_stack_00000010;
  CliqueVar in_stack_00000014;
  T tmp;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  sift_1;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  sift;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  cur;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  reference in_stack_ffffffffffffffa8;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_48;
  CliqueVar local_3c;
  CliqueVar local_38;
  CliqueVar local_34;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_30;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_28;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_20 [4];
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  if (!bVar1) {
    local_20[0] = __gnu_cxx::
                  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  ::operator+((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)in_stack_ffffffffffffffa8,
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98), bVar1) {
      local_28._M_current = local_20[0]._M_current;
      local_30 = __gnu_cxx::
                 __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                 ::operator-((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                              *)in_stack_ffffffffffffffa8,
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      pCVar2 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator*(&local_28);
      local_34 = *pCVar2;
      pCVar2 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator*(&local_30);
      local_38 = *pCVar2;
      bVar1 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                        (in_stack_00000008,in_stack_00000014,in_stack_00000010);
      if (bVar1) {
        pCVar2 = __gnu_cxx::
                 __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                 ::operator*(&local_28);
        local_3c = *pCVar2;
        do {
          in_stack_ffffffffffffffa8 =
               __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator*(&local_30);
          local_48 = __gnu_cxx::
                     __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                     ::operator--((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                                   *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4);
          pCVar2 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator*(&local_48);
          *pCVar2 = *in_stack_ffffffffffffffa8;
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                              *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                             in_stack_ffffffffffffff98);
          in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
          if (bVar1) {
            this = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_30);
            __gnu_cxx::
            __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
            ::operator*(this);
            bVar1 = HighsCliqueTable::bronKerboschRecurse::anon_class_8_1_898a9ca8::operator()
                              (in_stack_00000008,in_stack_00000014,in_stack_00000010);
            in_stack_ffffffffffffffa4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa4);
          }
        } while ((char)(in_stack_ffffffffffffffa4 >> 0x18) != '\0');
        pCVar2 = __gnu_cxx::
                 __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                 ::operator*(&local_28);
        *pCVar2 = local_3c;
      }
      __gnu_cxx::
      __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
      ::operator++(local_20);
    }
  }
  return;
}

Assistant:

inline void insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return;

        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
            }
        }
    }